

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool FIX::Message::isHeaderField(int field)

{
  if (field < 0xd4) {
    if ((0x37 < field - 0x5aU) || ((0xf000c106000081U >> ((ulong)(field - 0x5aU) & 0x3f) & 1) == 0))
    {
      if (0x39 < (uint)field) {
        return false;
      }
      if ((0x316080c00000300U >> ((ulong)(uint)field & 0x3f) & 1) == 0) {
        return false;
      }
    }
  }
  else if (field < 0x273) {
    if (((0x17 < field - 0x15bU) || ((0xc00001U >> (field - 0x15bU & 0x1f) & 1) == 0)) &&
       (1 < field - 0xd4U)) {
      return false;
    }
  }
  else if ((1 < field - 0x468U) && (field != 0x273)) {
    return false;
  }
  return true;
}

Assistant:

bool Message::isHeaderField( int field )
{
  switch ( field )
  {
    case FIELD::BeginString:
    case FIELD::BodyLength:
    case FIELD::MsgType:
    case FIELD::SenderCompID:
    case FIELD::TargetCompID:
    case FIELD::OnBehalfOfCompID:
    case FIELD::DeliverToCompID:
    case FIELD::SecureDataLen:
    case FIELD::MsgSeqNum:
    case FIELD::SenderSubID:
    case FIELD::SenderLocationID:
    case FIELD::TargetSubID:
    case FIELD::TargetLocationID:
    case FIELD::OnBehalfOfSubID:
    case FIELD::OnBehalfOfLocationID:
    case FIELD::DeliverToSubID:
    case FIELD::DeliverToLocationID:
    case FIELD::PossDupFlag:
    case FIELD::PossResend:
    case FIELD::SendingTime:
    case FIELD::OrigSendingTime:
    case FIELD::XmlDataLen:
    case FIELD::XmlData:
    case FIELD::MessageEncoding:
    case FIELD::LastMsgSeqNumProcessed:
    case FIELD::OnBehalfOfSendingTime:
    case FIELD::ApplVerID:
    case FIELD::CstmApplVerID:
    case FIELD::NoHops:
    return true;
    default:
    return false;
  };
}